

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

_Bool lookahead_0(ParserContext *context)

{
  _Bool _Var1;
  _Bool _Var2;
  TokenQueue *token_queue;
  Token *token;
  
  token_queue = TokenQueue_new();
  do {
    do {
      do {
        token = read_token(context);
        TokenQueue_add(token_queue,token);
        _Var1 = match_ScenarioLine(context,token);
        if (_Var1) goto LAB_0011dc6a;
        _Var2 = match_Empty(context,token);
      } while (_Var2);
      _Var2 = match_Comment(context,token);
    } while (_Var2);
    _Var2 = match_TagLine(context,token);
  } while (_Var2);
LAB_0011dc6a:
  TokenQueue_extend(context->token_queue,token_queue);
  return _Var1;
}

Assistant:

static bool lookahead_0(ParserContext* context) {
    Token* token = 0;
    TokenQueue* queue = TokenQueue_new();
    bool match = false;
    while (true) {
        token = read_token(context);
        TokenQueue_add(queue, token);

        if (match_ScenarioLine(context, token) || false) {
            match = true;
            break;
        }

        if (!(match_Empty(context, token) || match_Comment(context, token) || match_TagLine(context, token) || false)) {
            break;
        } 
    }

    TokenQueue_extend(context->token_queue, queue);

    return match;
}